

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int intGetOption(char *message)

{
  int iVar1;
  string temp;
  
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  std::operator<<((ostream *)&std::cout,message);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&temp);
  iVar1 = std::__cxx11::stoi(&temp,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&temp);
  return iVar1;
}

Assistant:

int intGetOption(const char *message){
	std::string temp;
	std::cout << message;
	std::getline(std::cin, temp);
	return std::stoi(temp);
}